

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void makeliteral_attr(strbuf *b,termchar *c,unsigned_long *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar val;
  uint colourbits;
  uint attr;
  unsigned_long *state_local;
  termchar *c_local;
  strbuf *b_local;
  uchar val_00;
  
  uVar3 = (uint)c->attr;
  uVar1 = (((uVar3 >> 0x11) << 0xd | uVar3 & 0x1fff) >> 8) << 4;
  uVar2 = uVar1 | uVar3 & 0xf;
  uVar3 = (uVar3 >> 4 & 0xf | (uVar3 >> 0xd & 0xf) << 4) << 0x17;
  uVar4 = uVar3 | uVar2;
  val = (uchar)uVar2;
  val_00 = (uchar)(uVar1 >> 8);
  if (uVar4 < 0x8000) {
    BinarySink_put_byte(b->binarysink_,val_00);
    BinarySink_put_byte(b->binarysink_,val);
  }
  else {
    BinarySink_put_byte(b->binarysink_,(byte)(uVar3 >> 0x18) | 0x80);
    BinarySink_put_byte(b->binarysink_,(uchar)(uVar4 >> 0x10));
    BinarySink_put_byte(b->binarysink_,val_00);
    BinarySink_put_byte(b->binarysink_,val);
  }
  return;
}

Assistant:

static void makeliteral_attr(strbuf *b, termchar *c, unsigned long *state)
{
    /*
     * My encoding for attributes is 16-bit-granular and assumes
     * that the top bit of the word is never required. I either
     * store a two-byte value with the top bit clear (indicating
     * just that value), or a four-byte value with the top bit set
     * (indicating the same value with its top bit clear).
     *
     * However, first I permute the bits of the attribute value, so
     * that the eight bits of colour (four in each of fg and bg)
     * which are never non-zero unless xterm 256-colour mode is in
     * use are placed higher up the word than everything else. This
     * ensures that attribute values remain 16-bit _unless_ the
     * user uses extended colour.
     */
    unsigned attr, colourbits;

    attr = c->attr;

    assert(ATTR_BGSHIFT > ATTR_FGSHIFT);

    colourbits = (attr >> (ATTR_BGSHIFT + 4)) & 0xF;
    colourbits <<= 4;
    colourbits |= (attr >> (ATTR_FGSHIFT + 4)) & 0xF;

    attr = (((attr >> (ATTR_BGSHIFT + 8)) << (ATTR_BGSHIFT + 4)) |
            (attr & ((1 << (ATTR_BGSHIFT + 4))-1)));
    attr = (((attr >> (ATTR_FGSHIFT + 8)) << (ATTR_FGSHIFT + 4)) |
            (attr & ((1 << (ATTR_FGSHIFT + 4))-1)));

    attr |= (colourbits << (32-9));

    if (attr < 0x8000) {
        put_byte(b, (unsigned char)((attr >> 8) & 0xFF));
        put_byte(b, (unsigned char)(attr & 0xFF));
    } else {
        put_byte(b, (unsigned char)(((attr >> 24) & 0x7F) | 0x80));
        put_byte(b, (unsigned char)((attr >> 16) & 0xFF));
        put_byte(b, (unsigned char)((attr >> 8) & 0xFF));
        put_byte(b, (unsigned char)(attr & 0xFF));
    }
}